

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

TimerId __thiscall sznet::net::EventLoop::runAt(EventLoop *this,Timestamp time,TimerCallback *cb)

{
  TimerQueue *this_00;
  _Manager_type p_Var1;
  TimerId TVar2;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  this_00 = (this->m_timerQueue)._M_t.
            super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>._M_t.
            super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>.
            super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl;
  local_28 = (_Manager_type)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  TVar2 = TimerQueue::addTimer(this_00,(TimerCallback *)&local_38,time,0.0);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return TVar2;
}

Assistant:

TimerId EventLoop::runAt(Timestamp time, TimerCallback cb)
{
	return m_timerQueue->addTimer(std::move(cb), time, 0.0);
}